

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

bool GGUFMeta::GKV<unsigned_short>::set
               (gguf_context *ctx,int k,unsigned_short *target,llama_model_kv_override *ovrd)

{
  type_conflict1 tVar1;
  unsigned_short uVar2;
  undefined2 in_CX;
  undefined6 in_register_0000000a;
  unsigned_short *in_RDX;
  int in_ESI;
  int in_stack_0000002c;
  gguf_context *in_stack_00000030;
  undefined1 local_1;
  
  tVar1 = try_override<unsigned_short>
                    ((unsigned_short *)CONCAT62(in_register_0000000a,in_CX),
                     (llama_model_kv_override *)0x463b54);
  if (tVar1) {
    local_1 = true;
  }
  else if (in_ESI < 0) {
    local_1 = false;
  }
  else {
    uVar2 = get_kv(in_stack_00000030,in_stack_0000002c);
    *in_RDX = uVar2;
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool set(const gguf_context * ctx, const int k, T & target, const struct llama_model_kv_override * ovrd = nullptr) {
            if (try_override<T>(target, ovrd)) {
                return true;
            }
            if (k < 0) { return false; }
            target = get_kv(ctx, k);
            return true;
        }